

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O3

void output_example(vw *all,example *ec,bool *hit_loss,multi_ex *ec_seq)

{
  uint64_t *puVar1;
  int iVar2;
  wclass *pwVar3;
  int *piVar4;
  _func_void_int_string_v_array<char> *p_Var5;
  double dVar6;
  v_array<char> vVar7;
  bool bVar8;
  char cVar9;
  long lVar10;
  ostream *poVar11;
  byte bVar12;
  uint32_t *puVar13;
  int *piVar14;
  float *pfVar15;
  long lVar16;
  long lVar17;
  float fVar18;
  string outputString;
  stringstream outputStringStream;
  undefined7 in_stack_fffffffffffffdd8;
  char in_stack_fffffffffffffddf;
  wclass *pwVar19;
  vw *pvVar20;
  undefined4 in_stack_fffffffffffffdf0;
  uint32_t prediction;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  pwVar3 = (ec->l).cs.costs._begin;
  pwVar19 = (ec->l).cs.costs._end;
  if ((((ec->tag)._end != (ec->tag)._begin) ||
      ((ec->super_example_predict).indices._end != (ec->super_example_predict).indices._begin)) &&
     (bVar8 = COST_SENSITIVE::ec_is_example_header(ec), !bVar8)) {
    puVar1 = &all->sd->total_features;
    *puVar1 = *puVar1 + ec->num_features;
    prediction = (ec->pred).multiclass;
    pvVar20 = all;
    cVar9 = (*(code *)PTR_test_label_002d4a80)();
    if (cVar9 == '\0') {
      if ((long)pwVar19 - (long)pwVar3 == 0) {
        dVar6 = 0.0;
      }
      else {
        bVar12 = *hit_loss;
        lVar10 = (long)pwVar19 - (long)pwVar3 >> 4;
        lVar10 = lVar10 + (ulong)(lVar10 == 0);
        puVar13 = &pwVar3->class_index;
        fVar18 = 0.0;
        do {
          if ((bVar12 & 1) != 0) break;
          if (prediction == *puVar13) {
            fVar18 = ((wclass *)(puVar13 + -1))->x;
            *hit_loss = true;
            bVar12 = 1;
          }
          puVar13 = puVar13 + 4;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
        dVar6 = (double)fVar18;
      }
      pvVar20->sd->sum_loss = pvVar20->sd->sum_loss + dVar6;
      pvVar20->sd->sum_loss_since_last_dump = dVar6 + pvVar20->sd->sum_loss_since_last_dump;
      all = pvVar20;
    }
    piVar4 = (all->final_prediction_sink)._end;
    for (piVar14 = (all->final_prediction_sink)._begin; piVar14 != piVar4; piVar14 = piVar14 + 1) {
      (*all->print)(*piVar14,(float)(ec->pred).multiclass,0.0,ec->tag);
    }
    if (0 < all->raw_prediction) {
      local_1f8 = local_1e8;
      local_1f0 = 0;
      local_1e8[0] = 0;
      std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_1f8,_S_out|_S_in);
      lVar10 = (long)pwVar19 - (long)pwVar3;
      all = pvVar20;
      if (lVar10 != 0) {
        lVar16 = lVar10 >> 4;
        pfVar15 = &pwVar3->partial_prediction;
        lVar17 = 0;
        do {
          if (lVar17 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,&stack0xfffffffffffffddf,1);
          }
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          in_stack_fffffffffffffddf = ':';
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,&stack0xfffffffffffffddf,1);
          std::ostream::_M_insert<double>((double)*pfVar15);
          lVar17 = lVar17 + 1;
          pfVar15 = pfVar15 + 4;
        } while (lVar16 + (ulong)(lVar16 == 0) != lVar17);
      }
      p_Var5 = all->print_text;
      iVar2 = all->raw_prediction;
      pvVar20 = all;
      std::__cxx11::stringbuf::str();
      vVar7._begin._7_1_ = in_stack_fffffffffffffddf;
      vVar7._begin._0_7_ = in_stack_fffffffffffffdd8;
      vVar7._end = (char *)lVar10;
      vVar7.end_array = (char *)pvVar20;
      vVar7.erase_count._0_4_ = in_stack_fffffffffffffdf0;
      vVar7.erase_count._4_4_ = prediction;
      (*p_Var5)(iVar2,(string)ec->tag,vVar7);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8);
      }
    }
    bVar8 = (bool)(*(code *)PTR_test_label_002d4a80)(&ec->l);
    COST_SENSITIVE::print_update(all,bVar8,ec,ec_seq,false,prediction);
  }
  return;
}

Assistant:

void output_example(vw& all, example& ec, bool& hit_loss, multi_ex* ec_seq)
{
  COST_SENSITIVE::label& ld = ec.l.cs;
  v_array<COST_SENSITIVE::wclass> costs = ld.costs;

  if (example_is_newline(ec)) return;
  if (COST_SENSITIVE::ec_is_example_header(ec)) return;

  all.sd->total_features += ec.num_features;

  float loss = 0.;

  uint32_t predicted_class = ec.pred.multiclass;

  if (!COST_SENSITIVE::cs_label.test_label(&ec.l))
  {
    for (size_t j=0; j<costs.size(); j++)
    {
      if (hit_loss) break;
      if (predicted_class == costs[j].class_index)
      {
        loss = costs[j].x;
        hit_loss = true;
      }
    }

    all.sd->sum_loss += loss;
    all.sd->sum_loss_since_last_dump += loss;
  }

  for (int sink : all.final_prediction_sink)
    all.print(sink, (float)ec.pred.multiclass, 0, ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0) outputStringStream << ' ';
      outputStringStream << costs[i].class_index << ':' << costs[i].partial_prediction;
    }
    //outputStringStream << endl;
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  COST_SENSITIVE::print_update(all, COST_SENSITIVE::cs_label.test_label(&ec.l), ec, ec_seq, false, predicted_class);
}